

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O1

int dwarf_dnames_sizes(Dwarf_Dnames_Head dn,Dwarf_Unsigned *comp_unit_count,Dwarf_Unsigned *param_3,
                      Dwarf_Unsigned *foreign_type_unit_count,Dwarf_Unsigned *bucket_count,
                      Dwarf_Unsigned *name_count,Dwarf_Unsigned *abbrev_table_size,
                      Dwarf_Unsigned *entry_pool_size,Dwarf_Unsigned *augmentation_string_size,
                      char **augmentation_string,Dwarf_Unsigned *section_size,
                      Dwarf_Half *table_version,Dwarf_Half *offset_size,Dwarf_Error *error)

{
  int iVar1;
  
  if ((dn == (Dwarf_Dnames_Head)0x0) || (dn->dn_magic != 0xabcd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: A call to dwarf_dnames_sizes() has a NULL Dwarf_Dnames_Head or an improper one."
                       );
    iVar1 = 1;
  }
  else {
    if (comp_unit_count != (Dwarf_Unsigned *)0x0) {
      *comp_unit_count = dn->dn_comp_unit_count;
    }
    if (param_3 != (Dwarf_Unsigned *)0x0) {
      *param_3 = dn->dn_local_type_unit_count;
    }
    if (foreign_type_unit_count != (Dwarf_Unsigned *)0x0) {
      *foreign_type_unit_count = dn->dn_foreign_type_unit_count;
    }
    if (bucket_count != (Dwarf_Unsigned *)0x0) {
      *bucket_count = dn->dn_bucket_count;
    }
    if (name_count != (Dwarf_Unsigned *)0x0) {
      *name_count = dn->dn_name_count;
    }
    if (abbrev_table_size != (Dwarf_Unsigned *)0x0) {
      *abbrev_table_size = dn->dn_abbrev_table_size;
    }
    if (entry_pool_size != (Dwarf_Unsigned *)0x0) {
      *entry_pool_size = dn->dn_entry_pool_size;
    }
    if (augmentation_string_size != (Dwarf_Unsigned *)0x0) {
      *augmentation_string_size = dn->dn_augmentation_string_size;
    }
    if (augmentation_string != (char **)0x0) {
      *augmentation_string = dn->dn_augmentation_string;
    }
    if (section_size != (Dwarf_Unsigned *)0x0) {
      *section_size = dn->dn_section_size;
    }
    if (table_version != (Dwarf_Half *)0x0) {
      *table_version = dn->dn_version;
    }
    iVar1 = 0;
    if (offset_size != (Dwarf_Half *)0x0) {
      *offset_size = dn->dn_offset_size;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int dwarf_dnames_sizes(Dwarf_Dnames_Head dn,
    /* The counts are entry counts, not byte sizes. */
    Dwarf_Unsigned * comp_unit_count,
    Dwarf_Unsigned * local_type_unit_count,
    Dwarf_Unsigned * foreign_type_unit_count,
    Dwarf_Unsigned * bucket_count,
    Dwarf_Unsigned * name_count,

    /* The following are counted in bytes */
    Dwarf_Unsigned * abbrev_table_size,
    Dwarf_Unsigned * entry_pool_size,
    Dwarf_Unsigned * augmentation_string_size,
    char          ** augmentation_string,
    Dwarf_Unsigned * section_size,
    Dwarf_Half     * table_version,
    Dwarf_Half     * offset_size,
    Dwarf_Error *    error)
{
    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: A call to dwarf_dnames_sizes() "
            "has a NULL Dwarf_Dnames_Head or an improper one.");
        return DW_DLV_ERROR;
    }
    if (comp_unit_count) {
        *comp_unit_count = dn->dn_comp_unit_count;
    }
    if (local_type_unit_count) {
        *local_type_unit_count = dn->dn_local_type_unit_count;
    }
    if (foreign_type_unit_count) {
        *foreign_type_unit_count = dn->dn_foreign_type_unit_count;
    }
    if (bucket_count) {
        *bucket_count = dn->dn_bucket_count;
    }
    if (name_count) {
        *name_count = dn->dn_name_count;
    }
    if (abbrev_table_size) {
        *abbrev_table_size = dn->dn_abbrev_table_size;
    }
    if (entry_pool_size) {
        *entry_pool_size = dn->dn_entry_pool_size;
    }
    if (augmentation_string_size) {
        *augmentation_string_size = dn->dn_augmentation_string_size;
    }
    if (augmentation_string) {
        *augmentation_string = dn->dn_augmentation_string;
    }
    if (section_size) {
        *section_size = dn->dn_section_size;
    }
    if (table_version) {
        *table_version = dn->dn_version;
    }
    if (offset_size) {
        *offset_size = dn->dn_offset_size;
    }
    return DW_DLV_OK;
}